

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::getAdaptationMatrix
               (float *m,int type,float wx0,float wy0,float wz0,float wx1,float wy1,float wz1)

{
  uint extraout_EAX;
  long lVar1;
  float bet0;
  float gam0;
  float bet1;
  float gam1;
  float rho1;
  float rho0;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  mulMatrix(&local_34,&local_44,&local_48,getAdaptationMatrix::bradford,(double)wx0,(double)wy0,
            (double)wz0);
  mulMatrix(&local_38,&local_3c,&local_40,getAdaptationMatrix::bradford,(double)wx1,(double)wy1,
            (double)wz1);
  lVar1 = 0;
  do {
    m[lVar1] = getAdaptationMatrix::bradford[lVar1] * (local_38 / local_34);
    m[lVar1 + 3] = getAdaptationMatrix::bradford[lVar1 + 3] * (local_3c / local_44);
    m[lVar1 + 6] = getAdaptationMatrix::bradford[lVar1 + 6] * (local_40 / local_48);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  mulMatrixMatrix(m,getAdaptationMatrix::bradfordinv,m);
  return extraout_EAX;
}

Assistant:

static unsigned getAdaptationMatrix(float* m, int type,
                                    float wx0, float wy0, float wz0,
                                    float wx1, float wy1, float wz1) {
  int i;
  static const float bradford[9] = {
    0.8951, 0.2664, -0.1614,
    -0.7502, 1.7135, 0.0367,
    0.0389, -0.0685, 1.0296
  };
  static const float bradfordinv[9] = {
    0.9869929, -0.1470543, 0.1599627,
    0.4323053, 0.5183603, 0.0492912,
   -0.0085287, 0.0400428, 0.9684867
  };
  static const float vonkries[9] = {
    0.40024, 0.70760, -0.08081,
    -0.22630, 1.16532, 0.04570,
    0.00000, 0.00000, 0.91822,
  };
  static const float vonkriesinv[9] = {
    1.8599364, -1.1293816, 0.2198974,
    0.3611914, 0.6388125, -0.0000064,
   0.0000000, 0.0000000, 1.0890636
  };
  if(type == 0) {
    for(i = 0; i < 9; i++) m[i] = 0;
    m[0] = wx1 / wx0;
    m[4] = wy1 / wy0;
    m[8] = wz1 / wz0;
  } else {
    const float* cat = (type == 1) ? bradford : vonkries;
    const float* inv = (type == 1) ? bradfordinv : vonkriesinv;
    float rho0, gam0, bet0, rho1, gam1, bet1, rho2, gam2, bet2;
    mulMatrix(&rho0, &gam0, &bet0, cat, wx0, wy0, wz0);
    mulMatrix(&rho1, &gam1, &bet1, cat, wx1, wy1, wz1);
    rho2 = rho1 / rho0;
    gam2 = gam1 / gam0;
    bet2 = bet1 / bet0;
    /* Multiply diagonal matrix with cat */
    for(i = 0; i < 3; i++) {
      m[i + 0] = rho2 * cat[i + 0];
      m[i + 3] = gam2 * cat[i + 3];
      m[i + 6] = bet2 * cat[i + 6];
    }
    mulMatrixMatrix(m, inv, m);
  }
  return 0; /* ok */
}